

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *doc,TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                  ,0x563,"ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *, TidyIterator *)");
  }
  p_Var3 = *iter;
  p_Var4 = (TidyIterator)(ulong)(doc->muted).count;
  if (p_Var3 == (TidyIterator)0x0) {
    p_Var3 = (TidyIterator)0x0;
  }
  else if (p_Var3 <= p_Var4) {
    ptVar1 = prvTidytidyErrorCodeAsKey((doc->muted).list[(long)((long)&p_Var3[-1]._opaque + 3)]);
    p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
    goto LAB_0014e918;
  }
  ptVar1 = (ctmbstr)0x0;
LAB_0014e918:
  p_Var2 = (TidyIterator)0x0;
  if (p_Var3 <= p_Var4) {
    p_Var2 = p_Var3;
  }
  *iter = p_Var2;
  return ptVar1;
}

Assistant:

ctmbstr TY_(getNextMutedMessage)( TidyDocImpl* doc, TidyIterator* iter )
{
    TidyMutedMessages *list = &(doc->muted);
    size_t index;
    ctmbstr result = NULL;
    assert( iter != NULL );
    index = (size_t)*iter;

    if ( index > 0 && index <= list->count )
    {
        result = TY_(tidyErrorCodeAsKey)(list->list[index-1]);
        index++;
    }
    *iter = (TidyIterator) ( index <= list->count ? index : (size_t)0 );

    return result;
}